

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_define_foreign_aux
               (sexp ctx,sexp env,char *name,int num_args,int flags,char *fname,sexp_proc1 f,
               sexp data)

{
  sexp res;
  sexp sym;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &sym;
  sym = (sexp)&DAT_0000043e;
  local_30.var = &res;
  res = (sexp)&DAT_0000043e;
  local_30.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  res = sexp_make_foreign(ctx,name,num_args,flags,fname,f,data);
  if ((((ulong)res & 3) != 0) || (res->tag != 0x13)) {
    sym = sexp_intern(ctx,name,-1);
    sexp_env_define(ctx,env,sym,res);
  }
  (ctx->value).context.saves = local_40.next;
  return res;
}

Assistant:

sexp sexp_define_foreign_aux (sexp ctx, sexp env, const char *name, int num_args,
                              int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var2(sym, res);
  sexp_gc_preserve2(ctx, sym, res);
  res = sexp_make_foreign(ctx, name, num_args, flags, fname, f, data);
  if (!sexp_exceptionp(res))
    sexp_env_define(ctx, env, sym = sexp_intern(ctx, name, -1), res);
  sexp_gc_release2(ctx);
  return res;
}